

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImVector<ImDrawList_*> *this;
  ImVector<ImDrawList_*> *pIVar1;
  int *piVar2;
  ImDrawList *this_00;
  ImVec2 *uv0;
  ImVec2 *uv1;
  ImVec2 IVar3;
  ImVec2 IVar4;
  uint uVar5;
  ImGuiWindow *window;
  _func_void_ImDrawData_ptr *p_Var6;
  ImGuiContext *pIVar7;
  int iVar8;
  value_type *ppIVar9;
  value_type *__dest;
  value_type *__src;
  ImDrawList **ppIVar10;
  long lVar11;
  int i;
  int iVar12;
  ImVector<ImDrawList_*> *pIVar13;
  ImVec2 pos;
  ImVec2 local_a8;
  ImTextureID local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  undefined8 uStack_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 *local_68;
  ImVec2 *local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar7 = GImGui;
  if (GImGui->Initialized != false) {
    iVar12 = GImGui->FrameCountEnded;
    if (iVar12 != GImGui->FrameCount) {
      EndFrame();
      iVar12 = pIVar7->FrameCount;
    }
    pIVar7->FrameCountRendered = iVar12;
    if (0.0 < (pIVar7->Style).Alpha) {
      (pIVar7->IO).MetricsActiveWindows = 0;
      (pIVar7->IO).MetricsRenderVertices = 0;
      (pIVar7->IO).MetricsRenderIndices = 0;
      this = pIVar7->RenderDrawLists;
      for (lVar11 = 0; lVar11 != 0x30; lVar11 = lVar11 + 0x10) {
        ImVector<ImDrawList_*>::resize((ImVector<ImDrawList_*> *)((long)&this->Size + lVar11),0);
      }
      pIVar1 = pIVar7->RenderDrawLists + 1;
      for (iVar12 = 0; iVar12 != (pIVar7->Windows).Size; iVar12 = iVar12 + 1) {
        ppIVar9 = ImVector<ImGuiWindow_*>::operator[](&pIVar7->Windows,iVar12);
        window = *ppIVar9;
        if (((window->Active == true) && (window->HiddenFrames < 1)) &&
           (uVar5 = window->Flags, (uVar5 >> 0x14 & 1) == 0)) {
          piVar2 = &(pIVar7->IO).MetricsActiveWindows;
          *piVar2 = *piVar2 + 1;
          pIVar13 = this;
          if ((uVar5 >> 0x18 & 1) != 0) {
            pIVar13 = pIVar7->RenderDrawLists + 2;
          }
          if ((uVar5 >> 0x19 & 1) != 0) {
            pIVar13 = pIVar1;
          }
          AddWindowToRenderList(pIVar13,window);
        }
      }
      iVar12 = pIVar7->RenderDrawLists[0].Size;
      ImVector<ImDrawList_*>::resize
                (this,pIVar7->RenderDrawLists[1].Size + iVar12 + pIVar7->RenderDrawLists[2].Size);
      for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 0x10) {
        if (*(int *)((long)&pIVar1->Size + lVar11) != 0) {
          pIVar13 = (ImVector<ImDrawList_*> *)((long)&pIVar1->Size + lVar11);
          __dest = ImVector<ImDrawList_*>::operator[](this,iVar12);
          __src = ImVector<ImDrawList_*>::operator[](pIVar13,0);
          memcpy(__dest,__src,(long)pIVar13->Size << 3);
          iVar12 = iVar12 + pIVar13->Size;
        }
      }
      if ((pIVar7->IO).MouseDrawCursor != false) {
        iVar12 = pIVar7->MouseCursor;
        IVar3 = (pIVar7->IO).MousePos;
        local_60 = pIVar7->MouseCursorData[iVar12].TexUvMin;
        IVar4 = pIVar7->MouseCursorData[iVar12].HotOffset;
        local_88.x = IVar3.x - IVar4.x;
        local_88.y = IVar3.y - IVar4.y;
        uStack_80 = 0;
        local_90.y = local_88.y;
        local_90.x = local_88.x;
        this_00 = &pIVar7->OverlayDrawList;
        local_58.y = local_88.y + 0.0;
        local_58.x = local_88.x + 1.0;
        uStack_50 = 0;
        local_78 = pIVar7->MouseCursorData[iVar12].Size;
        uStack_70 = 0;
        local_a0 = ((pIVar7->IO).Fonts)->TexID;
        ImDrawList::PushTextureID(this_00,&local_a0);
        local_a8 = local_58;
        local_48 = local_78.x + local_58.x;
        fStack_44 = local_78.y + local_58.y;
        fStack_40 = (float)uStack_70 + (float)uStack_50;
        fStack_3c = uStack_70._4_4_ + uStack_50._4_4_;
        local_98.y = fStack_44;
        local_98.x = local_48;
        uv0 = pIVar7->MouseCursorData[iVar12].TexUvMin + 1;
        local_68 = pIVar7->MouseCursorData[iVar12].TexUvMax;
        uv1 = pIVar7->MouseCursorData[iVar12].TexUvMax + 1;
        ImDrawList::AddImage(this_00,local_a0,&local_a8,&local_98,uv0,uv1,0x30000000);
        local_a8.y = local_58.y;
        local_a8.x = local_88.x + 2.0;
        local_98.y = fStack_44;
        local_98.x = local_88.x + 2.0 + local_78.x;
        ImDrawList::AddImage(this_00,local_a0,&local_a8,&local_98,uv0,uv1,0x30000000);
        local_88.x = local_88.x + local_78.x;
        local_88.y = local_88.y + local_78.y;
        uStack_80 = CONCAT44(uStack_80._4_4_ + uStack_70._4_4_,(float)uStack_80 + (float)uStack_70);
        local_a8.y = local_88.y;
        local_a8.x = local_88.x;
        ImDrawList::AddImage(this_00,local_a0,&local_90,&local_a8,uv0,uv1,0xff000000);
        local_a8 = local_88;
        ImDrawList::AddImage(this_00,local_a0,&local_90,&local_a8,local_60,local_68,0xffffffff);
        ImDrawList::PopTextureID(this_00);
      }
      if ((pIVar7->OverlayDrawList).VtxBuffer.Size != 0) {
        AddDrawListToRenderList(this,&pIVar7->OverlayDrawList);
      }
      (pIVar7->RenderDrawData).Valid = true;
      iVar12 = pIVar7->RenderDrawLists[0].Size;
      if (iVar12 < 1) {
        ppIVar10 = (ImDrawList **)0x0;
      }
      else {
        ppIVar10 = ImVector<ImDrawList_*>::operator[](this,0);
        iVar12 = this->Size;
      }
      (pIVar7->RenderDrawData).CmdLists = ppIVar10;
      (pIVar7->RenderDrawData).CmdListsCount = iVar12;
      iVar8 = (pIVar7->IO).MetricsRenderIndices;
      (pIVar7->RenderDrawData).TotalVtxCount = (pIVar7->IO).MetricsRenderVertices;
      (pIVar7->RenderDrawData).TotalIdxCount = iVar8;
      if ((0 < iVar12) &&
         (p_Var6 = (pIVar7->IO).RenderDrawListsFn, p_Var6 != (_func_void_ImDrawData_ptr *)0x0)) {
        (*p_Var6)(&pIVar7->RenderDrawData);
      }
    }
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0xa6e,"void ImGui::Render()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);   // Forgot to call ImGui::NewFrame()

    if (g.FrameCountEnded != g.FrameCount)
        ImGui::EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Skip render altogether if alpha is 0.0
    // Note that vertex buffers have been created and are wasted, so it is best practice that you don't create windows in the first place, or consistently respond to Begin() returning false.
    if (g.Style.Alpha > 0.0f)
    {
        // Gather windows to render
        g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsActiveWindows = 0;
        for (int i = 0; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
            g.RenderDrawLists[i].resize(0);
        for (int i = 0; i != g.Windows.Size; i++)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window->Active && window->HiddenFrames <= 0 && (window->Flags & (ImGuiWindowFlags_ChildWindow)) == 0)
            {
                // FIXME: Generalize this with a proper layering system so e.g. user can draw in specific layers, below text, ..
                g.IO.MetricsActiveWindows++;
                if (window->Flags & ImGuiWindowFlags_Popup)
                    AddWindowToRenderList(g.RenderDrawLists[1], window);
                else if (window->Flags & ImGuiWindowFlags_Tooltip)
                    AddWindowToRenderList(g.RenderDrawLists[2], window);
                else
                    AddWindowToRenderList(g.RenderDrawLists[0], window);
            }
        }

        // Flatten layers
        int n = g.RenderDrawLists[0].Size;
        int flattened_size = n;
        for (int i = 1; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
            flattened_size += g.RenderDrawLists[i].Size;
        g.RenderDrawLists[0].resize(flattened_size);
        for (int i = 1; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
        {
            ImVector<ImDrawList*>& layer = g.RenderDrawLists[i];
            if (layer.empty())
                continue;
            memcpy(&g.RenderDrawLists[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
            n += layer.Size;
        }

        // Draw software mouse cursor if requested
        if (g.IO.MouseDrawCursor)
        {
            const ImGuiMouseCursorData& cursor_data = g.MouseCursorData[g.MouseCursor];
            const ImVec2 pos = g.IO.MousePos - cursor_data.HotOffset;
            const ImVec2 size = cursor_data.Size;
            const ImTextureID tex_id = g.IO.Fonts->TexID;
            g.OverlayDrawList.PushTextureID(tex_id);
            g.OverlayDrawList.AddImage(tex_id, pos+ImVec2(1,0), pos+ImVec2(1,0) + size, cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,48));        // Shadow
            g.OverlayDrawList.AddImage(tex_id, pos+ImVec2(2,0), pos+ImVec2(2,0) + size, cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,48));        // Shadow
            g.OverlayDrawList.AddImage(tex_id, pos,             pos + size,             cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,255));       // Black border
            g.OverlayDrawList.AddImage(tex_id, pos,             pos + size,             cursor_data.TexUvMin[0], cursor_data.TexUvMax[0], IM_COL32(255,255,255,255)); // White fill
            g.OverlayDrawList.PopTextureID();
        }
        if (!g.OverlayDrawList.VtxBuffer.empty())
            AddDrawListToRenderList(g.RenderDrawLists[0], &g.OverlayDrawList);

        // Setup draw data
        g.RenderDrawData.Valid = true;
        g.RenderDrawData.CmdLists = (g.RenderDrawLists[0].Size > 0) ? &g.RenderDrawLists[0][0] : NULL;
        g.RenderDrawData.CmdListsCount = g.RenderDrawLists[0].Size;
        g.RenderDrawData.TotalVtxCount = g.IO.MetricsRenderVertices;
        g.RenderDrawData.TotalIdxCount = g.IO.MetricsRenderIndices;

        // Render. If user hasn't set a callback then they may retrieve the draw data via GetDrawData()
        if (g.RenderDrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
            g.IO.RenderDrawListsFn(&g.RenderDrawData);
    }
}